

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::FileOptions::ByteSizeLong(FileOptions *this)

{
  RepeatedPtrField<google::protobuf::UninterpretedOption> *this_00;
  uint uVar1;
  size_t sVar2;
  void **ppvVar3;
  const_iterator cVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  
  sVar2 = internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  lVar7 = sVar2 + (long)*(int *)((long)&this->field_0 + 0x28) * 2;
  this_00 = &(this->field_0)._impl_.uninterpreted_option_;
  ppvVar3 = internal::RepeatedPtrFieldBase::elements(&this_00->super_RepeatedPtrFieldBase);
  cVar4 = RepeatedPtrField<google::protobuf::UninterpretedOption>::end(this_00);
  for (; ppvVar3 != cVar4.it_; ppvVar3 = ppvVar3 + 1) {
    sVar2 = internal::WireFormatLite::MessageSize<google::protobuf::UninterpretedOption>
                      ((UninterpretedOption *)*ppvVar3);
    lVar7 = lVar7 + sVar2;
  }
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  sVar2 = lVar7 + (ulong)(uVar1 >> 10 & 2) +
          (ulong)(((((uVar1 & 0xbf000) >> 0xc) * 0x8040201 >> 3 & 0x11111111) * 0x11111111 >> 0x1c)
                 * 3);
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      sVar5 = internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.java_package_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar2 = sVar2 + sVar5 + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar5 = internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.java_outer_classname_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar2 = sVar2 + sVar5 + 1;
    }
    if ((uVar1 & 4) != 0) {
      sVar5 = internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.go_package_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar2 = sVar2 + sVar5 + 1;
    }
    if ((uVar1 & 8) != 0) {
      sVar5 = internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.objc_class_prefix_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar2 = sVar2 + sVar5 + 2;
    }
    if ((uVar1 & 0x10) != 0) {
      sVar5 = internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.csharp_namespace_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar2 = sVar2 + sVar5 + 2;
    }
    if ((uVar1 & 0x20) != 0) {
      sVar5 = internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.swift_prefix_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar2 = sVar2 + sVar5 + 2;
    }
    if ((uVar1 & 0x40) != 0) {
      sVar5 = internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.php_class_prefix_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar2 = sVar2 + sVar5 + 2;
    }
    if ((char)uVar1 < '\0') {
      sVar5 = internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.php_namespace_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar2 = sVar2 + sVar5 + 2;
    }
  }
  if ((uVar1 & 0x700) != 0) {
    if ((uVar1 >> 8 & 1) != 0) {
      sVar5 = internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.php_metadata_namespace_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar2 = sVar2 + sVar5 + 2;
    }
    if ((uVar1 >> 9 & 1) != 0) {
      sVar5 = internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.ruby_package_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar2 = sVar2 + sVar5 + 2;
    }
    if ((uVar1 >> 10 & 1) != 0) {
      sVar5 = internal::WireFormatLite::MessageSize<google::protobuf::FeatureSet>
                        ((this->field_0)._impl_.features_);
      sVar2 = sVar2 + sVar5 + 2;
    }
  }
  if ((uVar1 >> 0x12 & 1) != 0) {
    uVar6 = (long)(this->field_0)._impl_.optimize_for_ | 1;
    lVar7 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    sVar2 = sVar2 + ((int)lVar7 * 9 + 0x49U >> 6) + 1;
  }
  sVar2 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar2,&(this->field_0)._impl_._cached_size_);
  return sVar2;
}

Assistant:

::size_t FileOptions::ByteSizeLong() const {
  const FileOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.FileOptions)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
    {
      total_size += 2UL * this_._internal_uninterpreted_option_size();
      for (const auto& msg : this_._internal_uninterpreted_option()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += ::absl::popcount(0x000bf000u & cached_has_bits) * 3;
  total_size += static_cast<bool>(0x00000800u & cached_has_bits) * 2;
  if ((cached_has_bits & 0x000000ffu) != 0) {
    // optional string java_package = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_java_package());
    }
    // optional string java_outer_classname = 8;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_java_outer_classname());
    }
    // optional string go_package = 11;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_go_package());
    }
    // optional string objc_class_prefix = 36;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_objc_class_prefix());
    }
    // optional string csharp_namespace = 37;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_csharp_namespace());
    }
    // optional string swift_prefix = 39;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_swift_prefix());
    }
    // optional string php_class_prefix = 40;
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_php_class_prefix());
    }
    // optional string php_namespace = 41;
    if ((cached_has_bits & 0x00000080u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_php_namespace());
    }
  }
  if ((cached_has_bits & 0x00000700u) != 0) {
    // optional string php_metadata_namespace = 44;
    if ((cached_has_bits & 0x00000100u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_php_metadata_namespace());
    }
    // optional string ruby_package = 45;
    if ((cached_has_bits & 0x00000200u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_ruby_package());
    }
    // optional .google.protobuf.FeatureSet features = 50;
    if ((cached_has_bits & 0x00000400u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.features_);
    }
  }
   {
    // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
    if ((cached_has_bits & 0x00040000u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optimize_for());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}